

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O3

string * CoreML::Specification::CoreMLModels::
         VisionFeaturePrint_Objects_ObjectsVersion_Name_abi_cxx11_
                   (VisionFeaturePrint_Objects_ObjectsVersion value)

{
  int iVar1;
  string *psVar2;
  
  if (VisionFeaturePrint_Objects_ObjectsVersion_Name[abi:cxx11](CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects_ObjectsVersion)
      ::dummy == '\0') {
    iVar1 = __cxa_guard_acquire(&VisionFeaturePrint_Objects_ObjectsVersion_Name[abi:cxx11](CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects_ObjectsVersion)
                                 ::dummy);
    if (iVar1 != 0) {
      VisionFeaturePrint_Objects_ObjectsVersion_Name::dummy =
           google::protobuf::internal::InitializeEnumStrings
                     ((EnumEntry *)VisionFeaturePrint_Objects_ObjectsVersion_entries,
                      (int *)&VisionFeaturePrint_Objects_ObjectsVersion_entries_by_number,2,
                      (ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)VisionFeaturePrint_Objects_ObjectsVersion_strings_abi_cxx11_);
      __cxa_guard_release(&VisionFeaturePrint_Objects_ObjectsVersion_Name[abi:cxx11](CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects_ObjectsVersion)
                           ::dummy);
    }
  }
  iVar1 = google::protobuf::internal::LookUpEnumName
                    ((EnumEntry *)VisionFeaturePrint_Objects_ObjectsVersion_entries,
                     (int *)&VisionFeaturePrint_Objects_ObjectsVersion_entries_by_number,2,value);
  if (iVar1 == -1) {
    psVar2 = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
      google::protobuf::internal::InitProtobufDefaultsSlow();
    }
  }
  else {
    psVar2 = (string *)
             (VisionFeaturePrint_Objects_ObjectsVersion_strings_abi_cxx11_ + (long)iVar1 * 0x20);
  }
  return psVar2;
}

Assistant:

const std::string& VisionFeaturePrint_Objects_ObjectsVersion_Name(
    VisionFeaturePrint_Objects_ObjectsVersion value) {
  static const bool dummy =
      ::PROTOBUF_NAMESPACE_ID::internal::InitializeEnumStrings(
          VisionFeaturePrint_Objects_ObjectsVersion_entries,
          VisionFeaturePrint_Objects_ObjectsVersion_entries_by_number,
          2, VisionFeaturePrint_Objects_ObjectsVersion_strings);
  (void) dummy;
  int idx = ::PROTOBUF_NAMESPACE_ID::internal::LookUpEnumName(
      VisionFeaturePrint_Objects_ObjectsVersion_entries,
      VisionFeaturePrint_Objects_ObjectsVersion_entries_by_number,
      2, value);
  return idx == -1 ? ::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString() :
                     VisionFeaturePrint_Objects_ObjectsVersion_strings[idx].get();
}